

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O2

void print_last_session_error(char *function)

{
  uint uVar1;
  char *in_RAX;
  char *message;
  
  if (connected_session == (LIBSSH2_SESSION *)0x0) {
    fwrite("No session\n",0xb,1,_stderr);
    return;
  }
  message = in_RAX;
  uVar1 = libssh2_session_last_error(connected_session,&message,0,0);
  fprintf(_stderr,"%s failed (%d): %s\n",function,(ulong)uVar1,message);
  return;
}

Assistant:

void print_last_session_error(const char *function)
{
    if(connected_session) {
        char *message;
        int rc =
            libssh2_session_last_error(connected_session, &message, NULL, 0);
        fprintf(stderr, "%s failed (%d): %s\n", function, rc, message);
    }
    else {
        fprintf(stderr, "No session\n");
    }
}